

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O2

DecodeStatus DecodeVST1LN(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  DecodeStatus DVar1;
  uint *Decoder_00;
  uint64_t extraout_RDX;
  uint64_t Address_00;
  uint64_t extraout_RDX_00;
  uint64_t Address_01;
  uint64_t extraout_RDX_01;
  uint uVar2;
  uint uVar3;
  ulong Val;
  uint RegNo;
  DecodeStatus local_34;
  
  local_34 = MCDisassembler_Fail;
  Decoder_00 = &switchD_001c875e::switchdataD_003134a0;
  switch(Insn >> 10 & 3) {
  case 0:
    if ((Insn & 0x10) != 0) {
      return MCDisassembler_Fail;
    }
    uVar2 = Insn >> 5 & 7;
    Val = 0;
    break;
  case 1:
    if ((Insn & 0x20) != 0) {
      return MCDisassembler_Fail;
    }
    uVar2 = Insn >> 6 & 3;
    Val = (ulong)(Insn >> 3 & 2);
    break;
  case 2:
    if ((Insn & 0x40) != 0) {
      return MCDisassembler_Fail;
    }
    uVar2 = Insn >> 7 & 1;
    uVar3 = Insn >> 4 & 3;
    Val = (ulong)uVar3;
    if (uVar3 != 0) {
      if (uVar3 != 3) {
        return MCDisassembler_Fail;
      }
      Val = 4;
    }
    break;
  case 3:
    goto switchD_001c875e_caseD_3;
  }
  uVar3 = Insn >> 0x10 & 0xf;
  RegNo = Insn & 0xf;
  if (RegNo == 0xf) {
    local_34 = MCDisassembler_Success;
LAB_001c87f9:
    DVar1 = DecodeGPRRegisterClass(Inst,uVar3,Address,Decoder_00);
    if (DVar1 != MCDisassembler_Success) {
      if (DVar1 != MCDisassembler_SoftFail) goto LAB_001c887b;
      local_34 = MCDisassembler_SoftFail;
    }
    MCOperand_CreateImm0(Inst,Val);
    Address_01 = Address_00;
    if (RegNo != 0xf) {
      if (RegNo == 0xd) {
        MCOperand_CreateReg0(Inst,0);
        Address_01 = extraout_RDX_00;
      }
      else {
        DVar1 = DecodeGPRRegisterClass(Inst,RegNo,Address_00,Decoder_00);
        Address_01 = extraout_RDX_01;
        if (DVar1 != MCDisassembler_Success) {
          if (DVar1 != MCDisassembler_SoftFail) {
            return MCDisassembler_Fail;
          }
          local_34 = MCDisassembler_SoftFail;
        }
      }
    }
    DVar1 = DecodeDPRRegisterClass
                      (Inst,Insn >> 0x12 & 0x10 | Insn >> 0xc & 0xf,Address_01,Decoder_00);
    if (DVar1 != MCDisassembler_Success) {
      if (DVar1 != MCDisassembler_SoftFail) {
        return MCDisassembler_Fail;
      }
      local_34 = MCDisassembler_SoftFail;
    }
    MCOperand_CreateImm0(Inst,(ulong)uVar2);
  }
  else {
    local_34 = DecodeGPRRegisterClass(Inst,uVar3,Address,&switchD_001c875e::switchdataD_003134a0);
    Decoder_00 = (uint *)(ulong)(local_34 | 2);
    Address = extraout_RDX;
    if ((local_34 | 2) == MCDisassembler_Success) goto LAB_001c87f9;
LAB_001c887b:
    local_34 = MCDisassembler_Fail;
  }
switchD_001c875e_caseD_3:
  return local_34;
}

Assistant:

static DecodeStatus DecodeVST1LN(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	unsigned size, align = 0, index = 0;
	unsigned Rn = fieldFromInstruction_4(Insn, 16, 4);
	unsigned Rm = fieldFromInstruction_4(Insn, 0, 4);
	unsigned Rd = fieldFromInstruction_4(Insn, 12, 4);
	Rd |= fieldFromInstruction_4(Insn, 22, 1) << 4;
	size = fieldFromInstruction_4(Insn, 10, 2);

	switch (size) {
		default:
			return MCDisassembler_Fail;
		case 0:
			if (fieldFromInstruction_4(Insn, 4, 1))
				return MCDisassembler_Fail; // UNDEFINED
			index = fieldFromInstruction_4(Insn, 5, 3);
			break;
		case 1:
			if (fieldFromInstruction_4(Insn, 5, 1))
				return MCDisassembler_Fail; // UNDEFINED
			index = fieldFromInstruction_4(Insn, 6, 2);
			if (fieldFromInstruction_4(Insn, 4, 1))
				align = 2;
			break;
		case 2:
			if (fieldFromInstruction_4(Insn, 6, 1))
				return MCDisassembler_Fail; // UNDEFINED
			index = fieldFromInstruction_4(Insn, 7, 1);

			switch (fieldFromInstruction_4(Insn, 4, 2)) {
				case 0: 
					align = 0; break;
				case 3:
					align = 4; break;
				default:
					return MCDisassembler_Fail;
			}
			break;
	}

	if (Rm != 0xF) { // Writeback
		if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
			return MCDisassembler_Fail;
	}
	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;
	MCOperand_CreateImm0(Inst, align);
	if (Rm != 0xF) {
		if (Rm != 0xD) {
			if (!Check(&S, DecodeGPRRegisterClass(Inst, Rm, Address, Decoder)))
				return MCDisassembler_Fail;
		} else
			MCOperand_CreateReg0(Inst, 0);
	}

	if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd, Address, Decoder)))
		return MCDisassembler_Fail;
	MCOperand_CreateImm0(Inst, index);

	return S;
}